

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_tri_collision.cpp
# Opt level: O1

bool __thiscall
GIM_TRIANGLE_CALCULATION_CACHE::triangle_collision
          (GIM_TRIANGLE_CALCULATION_CACHE *this,btVector3 *u0,btVector3 *u1,btVector3 *u2,
          btScalar margin_u,btVector3 *v0,btVector3 *v1,btVector3 *v2,btScalar margin_v,
          GIM_TRIANGLE_CONTACT_DATA *contacts)

{
  btVector3 *clip_points;
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  btScalar *pbVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint local_68 [18];
  
  fVar10 = margin_u + margin_v;
  this->margin = fVar10;
  uVar2 = *(undefined8 *)(u0->m_floats + 2);
  *(undefined8 *)this->tu_vertices[0].m_floats = *(undefined8 *)u0->m_floats;
  *(undefined8 *)(this->tu_vertices[0].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(u1->m_floats + 2);
  *(undefined8 *)this->tu_vertices[1].m_floats = *(undefined8 *)u1->m_floats;
  *(undefined8 *)(this->tu_vertices[1].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(u2->m_floats + 2);
  *(undefined8 *)this->tu_vertices[2].m_floats = *(undefined8 *)u2->m_floats;
  *(undefined8 *)(this->tu_vertices[2].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(v0->m_floats + 2);
  *(undefined8 *)this->tv_vertices[0].m_floats = *(undefined8 *)v0->m_floats;
  *(undefined8 *)(this->tv_vertices[0].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(v1->m_floats + 2);
  *(undefined8 *)this->tv_vertices[1].m_floats = *(undefined8 *)v1->m_floats;
  *(undefined8 *)(this->tv_vertices[1].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(v2->m_floats + 2);
  *(undefined8 *)this->tv_vertices[2].m_floats = *(undefined8 *)v2->m_floats;
  *(undefined8 *)(this->tv_vertices[2].m_floats + 2) = uVar2;
  fVar11 = this->tv_vertices[1].m_floats[0];
  fVar12 = this->tv_vertices[0].m_floats[0];
  uVar2 = *(undefined8 *)(this->tv_vertices[1].m_floats + 1);
  uVar3 = *(undefined8 *)(this->tv_vertices[0].m_floats + 1);
  fVar20 = (float)uVar3;
  fVar21 = (float)((ulong)uVar3 >> 0x20);
  fVar15 = this->tv_vertices[2].m_floats[0];
  fVar17 = this->tv_vertices[2].m_floats[1];
  fVar16 = fVar17 - fVar20;
  fVar1 = this->tv_vertices[2].m_floats[2];
  fVar13 = (float)uVar2;
  fVar22 = (float)((ulong)uVar2 >> 0x20);
  fVar27 = fVar1 - fVar21;
  fVar28 = fVar15 - fVar12;
  fVar18 = (fVar13 - fVar20) * fVar27 - fVar16 * (fVar22 - fVar21);
  fVar19 = (fVar22 - fVar21) * fVar28 - fVar27 * (fVar11 - fVar12);
  *(ulong *)(this->tv_plane).super_btVector3.m_floats = CONCAT44(fVar19,fVar18);
  fVar28 = fVar16 * (fVar11 - fVar12) - fVar28 * (fVar13 - fVar20);
  (this->tv_plane).super_btVector3.m_floats[2] = fVar28;
  fVar27 = fVar28 * fVar28 + fVar18 * fVar18 + fVar19 * fVar19;
  fVar16 = 3.4028235e+38;
  if (1e-07 < fVar27) {
    fVar16 = (float)(0x5f3759df - ((uint)fVar27 >> 1));
    fVar16 = (fVar27 * -0.5 * fVar16 * fVar16 + 1.5) * fVar16;
  }
  if (fVar16 < 3.4028235e+38) {
    *(ulong *)(this->tv_plane).super_btVector3.m_floats = CONCAT44(fVar19 * fVar16,fVar18 * fVar16);
    (this->tv_plane).super_btVector3.m_floats[2] = fVar28 * fVar16;
  }
  fVar16 = (this->tv_plane).super_btVector3.m_floats[0];
  uVar2 = *(undefined8 *)((this->tv_plane).super_btVector3.m_floats + 1);
  fVar27 = this->tu_vertices[0].m_floats[0];
  fVar14 = this->tu_vertices[0].m_floats[1];
  fVar4 = this->tu_vertices[0].m_floats[2];
  fVar28 = this->tu_vertices[1].m_floats[0];
  fVar29 = (float)uVar2;
  fVar30 = (float)((ulong)uVar2 >> 0x20);
  fVar18 = this->tu_vertices[1].m_floats[1];
  fVar19 = this->tu_vertices[1].m_floats[2];
  fVar25 = this->tu_vertices[2].m_floats[0];
  fVar24 = this->tu_vertices[2].m_floats[1];
  fVar26 = this->tu_vertices[2].m_floats[2];
  fVar23 = fVar21 * fVar30 + fVar16 * fVar12 + fVar20 * fVar29;
  (this->tv_plane).super_btVector3.m_floats[3] = fVar23;
  fVar14 = (fVar4 * fVar30 + fVar27 * fVar16 + fVar14 * fVar29) - fVar23;
  fVar19 = (fVar19 * fVar30 + fVar28 * fVar16 + fVar18 * fVar29) - fVar23;
  *(ulong *)this->du = CONCAT44(fVar19,fVar14);
  fVar18 = (fVar26 * fVar30 + fVar25 * fVar16 + fVar24 * fVar29) - fVar23;
  this->du[2] = fVar18;
  this->du0du1 = fVar19 * fVar14;
  this->du0du2 = fVar14 * fVar18;
  if ((0.0 < fVar19 * fVar14) && (0.0 < fVar14 * fVar18)) {
    if (0.0 <= fVar14) {
      if (fVar19 <= fVar18) {
        fVar18 = fVar19;
      }
      if (fVar14 <= fVar18) {
        fVar18 = fVar14;
      }
      (this->distances).m_floats[0] = fVar18;
      if (fVar18 <= fVar10) goto LAB_0017a53a;
    }
    else {
      if (fVar18 <= fVar19) {
        fVar18 = fVar19;
      }
      if (fVar18 <= fVar14) {
        fVar18 = fVar14;
      }
      (this->distances).m_floats[0] = -fVar18;
      if (-fVar18 <= fVar10) {
        fVar18 = (fVar12 + fVar11) - fVar11;
        this->tv_vertices[1].m_floats[0] = fVar18;
        this->tv_vertices[0].m_floats[0] = (fVar12 + fVar11) - fVar18;
        fVar11 = (fVar20 + fVar13) - fVar13;
        fVar12 = (fVar21 + fVar22) - fVar22;
        this->tv_vertices[0].m_floats[1] = (fVar20 + fVar13) - fVar11;
        *(ulong *)(this->tv_vertices[1].m_floats + 1) = CONCAT44(fVar12,fVar11);
        this->tv_vertices[0].m_floats[2] = (fVar21 + fVar22) - fVar12;
        (this->tv_plane).super_btVector3.m_floats[0] = -fVar16;
        (this->tv_plane).super_btVector3.m_floats[1] = -fVar29;
        (this->tv_plane).super_btVector3.m_floats[2] = -fVar30;
        (this->tv_plane).super_btVector3.m_floats[3] = -fVar23;
        goto LAB_0017a53a;
      }
    }
    goto LAB_0017ab0c;
  }
  fVar24 = (fVar14 + fVar19 + fVar18) / 3.0;
  (this->distances).m_floats[0] = fVar24;
  if (0.0 <= fVar24) {
    if (fVar19 <= fVar18) {
      fVar18 = fVar19;
    }
    if (fVar14 <= fVar18) {
      fVar18 = fVar14;
    }
  }
  else {
    fVar24 = (fVar12 + fVar11) - fVar11;
    this->tv_vertices[1].m_floats[0] = fVar24;
    this->tv_vertices[0].m_floats[0] = (fVar12 + fVar11) - fVar24;
    fVar11 = (fVar20 + fVar13) - fVar13;
    fVar12 = (fVar21 + fVar22) - fVar22;
    this->tv_vertices[0].m_floats[1] = (fVar20 + fVar13) - fVar11;
    *(ulong *)(this->tv_vertices[1].m_floats + 1) = CONCAT44(fVar12,fVar11);
    this->tv_vertices[0].m_floats[2] = (fVar21 + fVar22) - fVar12;
    (this->tv_plane).super_btVector3.m_floats[0] = -fVar16;
    (this->tv_plane).super_btVector3.m_floats[1] = -fVar29;
    (this->tv_plane).super_btVector3.m_floats[2] = -fVar30;
    (this->tv_plane).super_btVector3.m_floats[3] = -fVar23;
    if (fVar18 <= fVar19) {
      fVar18 = fVar19;
    }
    if (fVar18 <= fVar14) {
      fVar18 = fVar14;
    }
    fVar18 = -fVar18;
  }
  (this->distances).m_floats[0] = fVar18;
LAB_0017a53a:
  uVar2 = *(undefined8 *)(this->tu_vertices[0].m_floats + 1);
  uVar3 = *(undefined8 *)(this->tu_vertices[1].m_floats + 1);
  fVar11 = (float)uVar2;
  fVar18 = (float)uVar3 - fVar11;
  fVar12 = (float)((ulong)uVar2 >> 0x20);
  fVar19 = (float)((ulong)uVar3 >> 0x20) - fVar12;
  fVar11 = this->tu_vertices[2].m_floats[1] - fVar11;
  fVar12 = this->tu_vertices[2].m_floats[2] - fVar12;
  fVar25 = fVar25 - fVar27;
  fVar16 = fVar18 * fVar12 - fVar11 * fVar19;
  fVar12 = fVar19 * fVar25 - fVar12 * (fVar28 - fVar27);
  *(ulong *)(this->tu_plane).super_btVector3.m_floats = CONCAT44(fVar12,fVar16);
  fVar19 = fVar11 * (fVar28 - fVar27) - fVar25 * fVar18;
  (this->tu_plane).super_btVector3.m_floats[2] = fVar19;
  fVar18 = fVar19 * fVar19 + fVar16 * fVar16 + fVar12 * fVar12;
  fVar11 = 3.4028235e+38;
  if (1e-07 < fVar18) {
    fVar11 = (float)(0x5f3759df - ((uint)fVar18 >> 1));
    fVar11 = (fVar18 * -0.5 * fVar11 * fVar11 + 1.5) * fVar11;
  }
  if (fVar11 < 3.4028235e+38) {
    *(ulong *)(this->tu_plane).super_btVector3.m_floats = CONCAT44(fVar12 * fVar11,fVar16 * fVar11);
    (this->tu_plane).super_btVector3.m_floats[2] = fVar19 * fVar11;
  }
  fVar11 = (this->tu_plane).super_btVector3.m_floats[0];
  uVar2 = *(undefined8 *)(this->tu_vertices[0].m_floats + 1);
  uVar3 = *(undefined8 *)((this->tu_plane).super_btVector3.m_floats + 1);
  fVar19 = this->tv_vertices[0].m_floats[0];
  fVar20 = this->tv_vertices[0].m_floats[1];
  fVar21 = this->tv_vertices[0].m_floats[2];
  fVar22 = (float)uVar3;
  fVar25 = (float)((ulong)uVar3 >> 0x20);
  fVar12 = this->tv_vertices[1].m_floats[1];
  fVar16 = this->tv_vertices[1].m_floats[0];
  fVar18 = this->tv_vertices[1].m_floats[2];
  fVar24 = (float)uVar2;
  fVar26 = (float)((ulong)uVar2 >> 0x20);
  fVar13 = fVar26 * fVar25 + fVar11 * fVar27 + fVar24 * fVar22;
  (this->tu_plane).super_btVector3.m_floats[3] = fVar13;
  fVar19 = (fVar21 * fVar25 + fVar11 * fVar19 + fVar20 * fVar22) - fVar13;
  fVar16 = (fVar18 * fVar25 + fVar16 * fVar11 + fVar12 * fVar22) - fVar13;
  *(ulong *)this->dv = CONCAT44(fVar16,fVar19);
  fVar12 = (fVar1 * fVar25 + fVar11 * fVar15 + fVar17 * fVar22) - fVar13;
  this->dv[2] = fVar12;
  this->dv0dv1 = fVar16 * fVar19;
  this->dv0dv2 = fVar19 * fVar12;
  if ((fVar16 * fVar19 <= 0.0) || (fVar19 * fVar12 <= 0.0)) {
    fVar15 = (fVar19 + fVar16 + fVar12) / 3.0;
    (this->distances).m_floats[1] = fVar15;
    if (0.0 <= fVar15) {
      if (fVar16 <= fVar12) {
        fVar12 = fVar16;
      }
      if (fVar19 <= fVar12) {
        fVar12 = fVar19;
      }
    }
    else {
      fVar15 = (fVar27 + fVar28) - fVar28;
      this->tu_vertices[1].m_floats[0] = fVar15;
      this->tu_vertices[0].m_floats[0] = (fVar27 + fVar28) - fVar15;
      uVar2 = *(undefined8 *)(this->tu_vertices[1].m_floats + 1);
      fVar15 = (float)uVar2;
      fVar17 = (float)((ulong)uVar2 >> 0x20);
      fVar24 = fVar24 + fVar15;
      fVar26 = fVar26 + fVar17;
      fVar15 = fVar24 - fVar15;
      fVar17 = fVar26 - fVar17;
      this->tu_vertices[0].m_floats[1] = fVar24 - fVar15;
      *(ulong *)(this->tu_vertices[1].m_floats + 1) = CONCAT44(fVar17,fVar15);
      this->tu_vertices[0].m_floats[2] = fVar26 - fVar17;
      (this->tu_plane).super_btVector3.m_floats[0] = -fVar11;
      (this->tu_plane).super_btVector3.m_floats[1] = -fVar22;
      (this->tu_plane).super_btVector3.m_floats[2] = -fVar25;
      (this->tu_plane).super_btVector3.m_floats[3] = -fVar13;
      if (fVar12 <= fVar16) {
        fVar12 = fVar16;
      }
      if (fVar12 <= fVar19) {
        fVar12 = fVar19;
      }
      fVar12 = -fVar12;
    }
    (this->distances).m_floats[1] = fVar12;
  }
  else if (0.0 <= fVar19) {
    if (fVar16 <= fVar12) {
      fVar12 = fVar16;
    }
    if (fVar19 <= fVar12) {
      fVar12 = fVar19;
    }
    (this->distances).m_floats[1] = fVar12;
    if (fVar10 < fVar12) goto LAB_0017ab0c;
  }
  else {
    if (fVar12 <= fVar16) {
      fVar12 = fVar16;
    }
    if (fVar12 <= fVar19) {
      fVar12 = fVar19;
    }
    (this->distances).m_floats[1] = -fVar12;
    if (fVar10 < -fVar12) {
LAB_0017ab0c:
      uVar6 = 0;
      goto LAB_0017ab0e;
    }
    fVar12 = (fVar27 + fVar28) - fVar28;
    this->tu_vertices[1].m_floats[0] = fVar12;
    this->tu_vertices[0].m_floats[0] = (fVar27 + fVar28) - fVar12;
    uVar2 = *(undefined8 *)(this->tu_vertices[1].m_floats + 1);
    fVar12 = (float)uVar2;
    fVar15 = (float)((ulong)uVar2 >> 0x20);
    fVar24 = fVar24 + fVar12;
    fVar26 = fVar26 + fVar15;
    fVar12 = fVar24 - fVar12;
    fVar15 = fVar26 - fVar15;
    this->tu_vertices[0].m_floats[1] = fVar24 - fVar12;
    *(ulong *)(this->tu_vertices[1].m_floats + 1) = CONCAT44(fVar15,fVar12);
    this->tu_vertices[0].m_floats[2] = fVar26 - fVar15;
    (this->tu_plane).super_btVector3.m_floats[0] = -fVar11;
    (this->tu_plane).super_btVector3.m_floats[1] = -fVar22;
    (this->tu_plane).super_btVector3.m_floats[2] = -fVar25;
    (this->tu_plane).super_btVector3.m_floats[3] = -fVar13;
  }
  fVar11 = (this->distances).m_floats[1];
  clip_points = this->contact_points;
  if ((this->distances).m_floats[0] <= fVar11 && fVar11 != (this->distances).m_floats[0]) {
    uVar5 = clip_triangle(this,&this->tu_plane,this->tu_vertices,this->tv_vertices,clip_points);
    uVar6 = 0;
    if (uVar5 == 0) goto LAB_0017ab0e;
    fVar11 = this->margin;
    uVar2 = *(undefined8 *)((this->tu_plane).super_btVector3.m_floats + 2);
    *(undefined8 *)(contacts + 8) = *(undefined8 *)(this->tu_plane).super_btVector3.m_floats;
    *(undefined8 *)(contacts + 0x10) = uVar2;
    *(undefined8 *)contacts = 0xc47a0000;
    pbVar8 = this->contact_points[0].m_floats + 2;
    uVar9 = 0;
    do {
      fVar12 = fVar11 - (((this->tu_plane).super_btVector3.m_floats[2] * *pbVar8 +
                         (this->tu_plane).super_btVector3.m_floats[0] *
                         ((btVector3 *)(pbVar8 + -2))->m_floats[0] +
                         (this->tu_plane).super_btVector3.m_floats[1] * pbVar8[-1]) -
                        (this->tu_plane).super_btVector3.m_floats[3]);
      if (0.0 <= fVar12) {
        if (fVar12 <= *(float *)contacts) {
          if (fVar12 + 1.1920929e-07 < *(float *)contacts) goto LAB_0017aa82;
          local_68[uVar6] = (uint)uVar9;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        else {
          *(float *)contacts = fVar12;
          local_68[0] = (uint)uVar9;
          uVar6 = 1;
        }
        *(int *)(contacts + 4) = (int)uVar6;
      }
LAB_0017aa82:
      uVar9 = uVar9 + 1;
      pbVar8 = pbVar8 + 4;
    } while (uVar5 != uVar9);
    uVar5 = *(uint *)(contacts + 4);
    if ((ulong)uVar5 != 0) {
      lVar7 = 0;
      do {
        uVar2 = *(undefined8 *)(clip_points[*(uint *)((long)local_68 + lVar7)].m_floats + 2);
        *(undefined8 *)(contacts + lVar7 * 4 + 0x18) =
             *(undefined8 *)clip_points[*(uint *)((long)local_68 + lVar7)].m_floats;
        *(undefined8 *)(contacts + lVar7 * 4 + 0x18 + 8) = uVar2;
        lVar7 = lVar7 + 4;
      } while ((ulong)uVar5 << 2 != lVar7);
    }
    *(ulong *)(contacts + 8) = *(ulong *)(contacts + 8) ^ 0x8000000080000000;
    *(uint *)(contacts + 0x10) = *(uint *)(contacts + 0x10) ^ 0x80000000;
  }
  else {
    uVar5 = clip_triangle(this,&this->tv_plane,this->tv_vertices,this->tu_vertices,clip_points);
    uVar6 = 0;
    if (uVar5 == 0) goto LAB_0017ab0e;
    fVar11 = this->margin;
    uVar2 = *(undefined8 *)((this->tv_plane).super_btVector3.m_floats + 2);
    *(undefined8 *)(contacts + 8) = *(undefined8 *)(this->tv_plane).super_btVector3.m_floats;
    *(undefined8 *)(contacts + 0x10) = uVar2;
    *(undefined8 *)contacts = 0xc47a0000;
    pbVar8 = this->contact_points[0].m_floats + 2;
    uVar9 = 0;
    do {
      fVar12 = fVar11 - (((this->tv_plane).super_btVector3.m_floats[2] * *pbVar8 +
                         (this->tv_plane).super_btVector3.m_floats[0] *
                         ((btVector3 *)(pbVar8 + -2))->m_floats[0] +
                         (this->tv_plane).super_btVector3.m_floats[1] * pbVar8[-1]) -
                        (this->tv_plane).super_btVector3.m_floats[3]);
      if (0.0 <= fVar12) {
        if (fVar12 <= *(float *)contacts) {
          if (fVar12 + 1.1920929e-07 < *(float *)contacts) goto LAB_0017a985;
          local_68[uVar6] = (uint)uVar9;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        else {
          *(float *)contacts = fVar12;
          local_68[0] = (uint)uVar9;
          uVar6 = 1;
        }
        *(int *)(contacts + 4) = (int)uVar6;
      }
LAB_0017a985:
      uVar9 = uVar9 + 1;
      pbVar8 = pbVar8 + 4;
    } while (uVar5 != uVar9);
    uVar5 = *(uint *)(contacts + 4);
    if ((ulong)uVar5 != 0) {
      lVar7 = 0;
      do {
        uVar2 = *(undefined8 *)(clip_points[*(uint *)((long)local_68 + lVar7)].m_floats + 2);
        *(undefined8 *)(contacts + lVar7 * 4 + 0x18) =
             *(undefined8 *)clip_points[*(uint *)((long)local_68 + lVar7)].m_floats;
        *(undefined8 *)(contacts + lVar7 * 4 + 0x18 + 8) = uVar2;
        lVar7 = lVar7 + 4;
      } while ((ulong)uVar5 << 2 != lVar7);
    }
  }
  uVar6 = (ulong)(*(int *)(contacts + 4) != 0);
LAB_0017ab0e:
  return SUB81(uVar6,0);
}

Assistant:

SIMD_FORCE_INLINE bool triangle_collision(
					const btVector3 & u0,
					const btVector3 & u1,
					const btVector3 & u2,
					GREAL margin_u,
					const btVector3 & v0,
					const btVector3 & v1,
					const btVector3 & v2,
					GREAL margin_v,
					GIM_TRIANGLE_CONTACT_DATA & contacts)
	{

		margin = margin_u + margin_v;

		tu_vertices[0] = u0;
		tu_vertices[1] = u1;
		tu_vertices[2] = u2;

		tv_vertices[0] = v0;
		tv_vertices[1] = v1;
		tv_vertices[2] = v2;

		//create planes
		// plane v vs U points

		TRIANGLE_PLANE(tv_vertices[0],tv_vertices[1],tv_vertices[2],tv_plane);

		du[0] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[0]);
		du[1] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[1]);
		du[2] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[2]);


		du0du1 = du[0] * du[1];
		du0du2 = du[0] * du[2];


		if(du0du1>0.0f && du0du2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(du[0]<0) //we need test behind the triangle plane
			{
				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
				if(distances[0]>margin) return false; //never intersect

				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
				if(distances[0]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[0] = (du[0]+du[1]+du[2])/3.0f; //centroid

			if(distances[0]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);

				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
			}
		}


		// plane U vs V points

		TRIANGLE_PLANE(tu_vertices[0],tu_vertices[1],tu_vertices[2],tu_plane);

		dv[0] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[0]);
		dv[1] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[1]);
		dv[2] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[2]);

		dv0dv1 = dv[0] * dv[1];
		dv0dv2 = dv[0] * dv[2];


		if(dv0dv1>0.0f && dv0dv2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(dv[0]<0) //we need test behind the triangle plane
			{
				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
				if(distances[1]>margin) return false; //never intersect

				//reorder triangle u
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
				if(distances[1]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[1] = (dv[0]+dv[1]+dv[2])/3.0f; //centroid

			if(distances[1]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);

				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
			}
		}

		GUINT bl;
		/* bl = cross_line_intersection_test();
		if(bl==3)
		{
			//take edge direction too
			bl = distances.maxAxis();
		}
		else
		{*/
			bl = 0;
			if(distances[0]<distances[1]) bl = 1;
		//}

		if(bl==2) //edge edge separation
		{
			if(distances[2]>margin) return false;

			contacts.m_penetration_depth = -distances[2] + margin;
			contacts.m_points[0] = closest_point_v;
			contacts.m_point_count = 1;
			VEC_COPY(contacts.m_separating_normal,edge_edge_dir);

			return true;
		}

		//clip face against other

		
		GUINT point_count;
		//TODO
		if(bl == 0) //clip U points against V
		{
			point_count = clip_triangle(tv_plane,tv_vertices,tu_vertices,contact_points);
			if(point_count == 0) return false;						
			contacts.merge_points(tv_plane,margin,contact_points,point_count);			
		}
		else //clip V points against U
		{
			point_count = clip_triangle(tu_plane,tu_vertices,tv_vertices,contact_points);
			if(point_count == 0) return false;			
			contacts.merge_points(tu_plane,margin,contact_points,point_count);
			contacts.m_separating_normal *= -1.f;
		}
		if(contacts.m_point_count == 0) return false;
		return true;
	}